

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

void __thiscall
llvm::Expected<llvm::DWARFDebugNames::Abbrev>::Expected<llvm::DWARFDebugNames::Abbrev>
          (Expected<llvm::DWARFDebugNames::Abbrev> *this,Abbrev *Val,type *param_2)

{
  pointer pAVar1;
  storage_type *psVar2;
  
  this->field_0x20 = this->field_0x20 & 0xfe;
  psVar2 = getStorage(this);
  psVar2->Code = Val->Code;
  psVar2->Tag = Val->Tag;
  pAVar1 = (Val->Attributes).
           super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (psVar2->Attributes).
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (Val->Attributes).
       super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (psVar2->Attributes).
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_finish = pAVar1;
  (psVar2->Attributes).
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (Val->Attributes).
       super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (Val->Attributes).
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (Val->Attributes).
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (Val->Attributes).
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Expected(OtherT &&Val,
           typename std::enable_if<std::is_convertible<OtherT, T>::value>::type
               * = nullptr)
      : HasError(false)
#if LLVM_ENABLE_ABI_BREAKING_CHECKS
        // Expected is unchecked upon construction in Debug builds.
        , Unchecked(true)
#endif
  {
    new (getStorage()) storage_type(std::forward<OtherT>(Val));
  }